

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paramdict.cpp
# Opt level: O2

ReturnType __thiscall
pbrt::ParameterDictionary::lookupSingle<(pbrt::ParameterType)7>
          (ParameterDictionary *this,string *name,ReturnType defaultValue)

{
  anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
  *paVar1;
  size_t sVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  bool bVar3;
  long lVar4;
  char *fmt;
  anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
  *paVar5;
  Tuple3<pbrt::Normal3,_float> TVar6;
  
  paVar1 = (anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
            *)(this->params).ptr;
  sVar2 = (this->params).nStored;
  paVar5 = &(this->params).field_2;
  if (paVar1 != (anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
                 *)0x0) {
    paVar5 = paVar1;
  }
  lVar4 = 0;
  while( true ) {
    if (sVar2 << 3 == lVar4) {
      return (ReturnType)defaultValue.super_Tuple3<pbrt::Normal3,_float>;
    }
    __lhs = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
             ((long)paVar5 + lVar4);
    bVar3 = std::operator!=(__lhs + 1,name);
    if ((!bVar3) && (bVar3 = std::operator!=(__lhs,"normal"), !bVar3)) break;
    lVar4 = lVar4 + 8;
  }
  if (__lhs[3].field_2._M_allocated_capacity == 0) {
    fmt = "No values provided for parameter \"%s\".";
  }
  else {
    if (__lhs[3].field_2._M_allocated_capacity < 4) {
      __lhs[5].field_2._M_local_buf[8] = '\x01';
      TVar6 = (Tuple3<pbrt::Normal3,_float>)
              ParameterTypeTraits<(pbrt::ParameterType)7>::Convert
                        ((double *)__lhs[3]._M_dataplus._M_p,(FileLoc *)(__lhs + 2));
      return (ReturnType)TVar6;
    }
    fmt = "More than one value provided for parameter \"%s\".";
  }
  ErrorExit<std::__cxx11::string_const&>((FileLoc *)(__lhs + 2),fmt,name);
}

Assistant:

typename ParameterTypeTraits<PT>::ReturnType ParameterDictionary::lookupSingle(
    const std::string &name,
    typename ParameterTypeTraits<PT>::ReturnType defaultValue) const {
    // Search _params_ for parameter _name_
    using traits = ParameterTypeTraits<PT>;
    for (const ParsedParameter *p : params) {
        if (p->name != name || p->type != traits::typeName)
            continue;
        // Extract parameter values from _p_
        const auto &values = traits::GetValues(*p);

        // Issue error if incorrect number of parameter values were provided
        if (values.empty())
            ErrorExit(&p->loc, "No values provided for parameter \"%s\".", name);
        if (values.size() > traits::nPerItem)
            ErrorExit(&p->loc, "More than one value provided for parameter \"%s\".",
                      name);

        // Return parameter values as _ReturnType_
        p->lookedUp = true;
        return traits::Convert(values.data(), &p->loc);
    }

    return defaultValue;
}